

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_register_name(Context_conflict2 *ctx,RegisterType *rtype,int *rnum)

{
  bool bVar1;
  uint in_EAX;
  Token TVar2;
  RegisterType RVar3;
  int extraout_EAX;
  int iVar4;
  RegisterType extraout_EAX_00;
  RegisterType extraout_EAX_01;
  RegisterType extraout_EAX_02;
  uint32 uVar5;
  RegisterType RVar6;
  uint uStack_38;
  uint32 ui32;
  
  uStack_38 = in_EAX;
  TVar2 = nexttoken(ctx);
  if (TVar2 != TOKEN_IDENTIFIER) {
    fail(ctx,"Expected register");
    return extraout_EAX;
  }
  RVar3 = check_token_segment(ctx,"oDepth");
  if (RVar3 != REG_TYPE_TEMP) {
    RVar6 = REG_TYPE_DEPTHOUT;
    uVar5 = 0;
    goto LAB_00137f37;
  }
  RVar3 = check_token_segment(ctx,"vFace");
  RVar6 = REG_TYPE_MISCTYPE;
  if (RVar3 != REG_TYPE_TEMP) {
LAB_00137f08:
    uVar5 = 1;
    goto LAB_00137f37;
  }
  RVar3 = check_token_segment(ctx,"vPos");
  uVar5 = 0;
  if (RVar3 != REG_TYPE_TEMP) goto LAB_00137f37;
  RVar3 = check_token_segment(ctx,"oPos");
  RVar6 = REG_TYPE_RASTOUT;
  if (RVar3 != REG_TYPE_TEMP) goto LAB_00137f37;
  RVar3 = check_token_segment(ctx,"oFog");
  if (RVar3 != REG_TYPE_TEMP) goto LAB_00137f08;
  RVar3 = check_token_segment(ctx,"oPts");
  if (RVar3 != REG_TYPE_TEMP) {
    uVar5 = 2;
    goto LAB_00137f37;
  }
  RVar3 = check_token_segment(ctx,"aL");
  if (RVar3 != REG_TYPE_TEMP) {
    RVar6 = REG_TYPE_LOOP;
    uVar5 = 0;
    goto LAB_00137f37;
  }
  iVar4 = check_token_segment(ctx,"oC");
  if (iVar4 == 0) {
    iVar4 = check_token_segment(ctx,"oT");
    RVar6 = REG_TYPE_OUTPUT;
    if (iVar4 != 0) goto LAB_00137fc4;
    iVar4 = check_token_segment(ctx,"oD");
    bVar1 = false;
    if (iVar4 == 0) {
      iVar4 = check_token_segment(ctx,"r");
      if (iVar4 == 0) {
        iVar4 = check_token_segment(ctx,"v");
        if (iVar4 == 0) {
          iVar4 = check_token_segment(ctx,"c");
          if (iVar4 != 0) {
            RVar6 = REG_TYPE_CONST;
            bVar1 = true;
            goto LAB_00137fc7;
          }
          iVar4 = check_token_segment(ctx,"i");
          if (iVar4 == 0) {
            iVar4 = check_token_segment(ctx,"b");
            if (iVar4 == 0) {
              iVar4 = check_token_segment(ctx,"s");
              if (iVar4 == 0) {
                iVar4 = check_token_segment(ctx,"l");
                if (iVar4 == 0) {
                  iVar4 = check_token_segment(ctx,"p");
                  if (iVar4 == 0) {
                    iVar4 = check_token_segment(ctx,"o");
                    if (iVar4 == 0) {
                      iVar4 = check_token_segment(ctx,"a");
                      RVar6 = REG_TYPE_ADDRESS;
                      if (iVar4 == 0) {
                        iVar4 = check_token_segment(ctx,"t");
                        uVar5 = 0;
                        bVar1 = false;
                        if (iVar4 == 0) {
                          fail(ctx,"expected register type");
                          RVar6 = REG_TYPE_CONST;
                          RVar3 = extraout_EAX_02;
                          goto LAB_00137f37;
                        }
                        goto LAB_00137fc7;
                      }
                    }
                  }
                  else {
                    RVar6 = REG_TYPE_MAX;
                  }
                }
                else {
                  RVar6 = REG_TYPE_LABEL;
                }
              }
              else {
                RVar6 = REG_TYPE_SAMPLER;
              }
            }
            else {
              RVar6 = REG_TYPE_CONSTBOOL;
            }
          }
          else {
            RVar6 = REG_TYPE_CONSTINT;
          }
        }
        else {
          RVar6 = REG_TYPE_INPUT;
        }
        goto LAB_00137fc4;
      }
      RVar6 = REG_TYPE_TEMP;
    }
    else {
      RVar6 = REG_TYPE_ATTROUT;
      bVar1 = false;
    }
  }
  else {
    RVar6 = REG_TYPE_COLOROUT;
LAB_00137fc4:
    bVar1 = false;
  }
LAB_00137fc7:
  if (ctx->tokenlen == 0) {
    TVar2 = nexttoken(ctx);
    pushback(ctx);
    ctx->tokenlen = 0;
    if (TVar2 == 0x5b) {
      RVar3 = REG_TYPE_CONST;
      if (bVar1) {
        RVar6 = RVar3;
      }
      uVar5 = 0;
      goto LAB_00137f37;
    }
  }
  _uStack_38 = (ulong)uStack_38;
  RVar3 = ui32fromtoken(ctx,&ui32);
  if (RVar3 == REG_TYPE_TEMP) {
    fail(ctx,"Invalid register index");
    RVar3 = extraout_EAX_00;
  }
  uVar5 = ui32;
  if ((bVar1) && (RVar6 = REG_TYPE_CONST, 0x7ff < (int)ui32)) {
    if (ui32 < 0x1000) {
      uVar5 = ui32 - 0x800;
      RVar6 = REG_TYPE_CONST2;
    }
    else if (ui32 < 0x1800) {
      uVar5 = ui32 - 0x1000;
      RVar6 = REG_TYPE_CONST3;
    }
    else if (ui32 < 0x2000) {
      uVar5 = ui32 - 0x1800;
      RVar6 = REG_TYPE_CONST4;
    }
    else {
      fail(ctx,"Invalid const register index");
      RVar3 = extraout_EAX_01;
    }
  }
LAB_00137f37:
  *rtype = RVar6;
  *rnum = uVar5;
  return RVar3;
}

Assistant:

static int parse_register_name(Context *ctx, RegisterType *rtype, int *rnum)
{
    if (nexttoken(ctx) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected register");
        return 0;
    } // if

    int neednum = 1;
    int regnum = 0;
    RegisterType regtype = REG_TYPE_TEMP;

    // Watch out for substrings! oDepth must be checked before oD, since
    //  the latter will match either case.
    if (check_token_segment(ctx, "oDepth"))
    {
        regtype = REG_TYPE_DEPTHOUT;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vFace"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_FACE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vPos"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPos"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oFog"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_FOG;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPts"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POINT_SIZE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "aL"))
    {
        regtype = REG_TYPE_LOOP;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oC"))
        regtype = REG_TYPE_COLOROUT;
    else if (check_token_segment(ctx, "oT"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "oD"))
        regtype = REG_TYPE_ATTROUT;
    else if (check_token_segment(ctx, "r"))
        regtype = REG_TYPE_TEMP;
    else if (check_token_segment(ctx, "v"))
        regtype = REG_TYPE_INPUT;
    else if (check_token_segment(ctx, "c"))
        regtype = REG_TYPE_CONST;
    else if (check_token_segment(ctx, "i"))
        regtype = REG_TYPE_CONSTINT;
    else if (check_token_segment(ctx, "b"))
        regtype = REG_TYPE_CONSTBOOL;
    else if (check_token_segment(ctx, "s"))
        regtype = REG_TYPE_SAMPLER;
    else if (check_token_segment(ctx, "l"))
        regtype = REG_TYPE_LABEL;
    else if (check_token_segment(ctx, "p"))
        regtype = REG_TYPE_PREDICATE;
    else if (check_token_segment(ctx, "o"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "a"))
        regtype = REG_TYPE_ADDRESS;
    else if (check_token_segment(ctx, "t"))
        regtype = REG_TYPE_ADDRESS;
        
    //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string

    else
    {
        fail(ctx, "expected register type");
        regtype = REG_TYPE_CONST;
        regnum = 0;
        neednum = 0;
    } // else

    // "c[5]" is the same as "c5", so if the token is done, see if next is '['.
    if ((neednum) && (ctx->tokenlen == 0))
    {
        const int tlen = ctx->tokenlen;  // we need to protect this for later.
        if (nexttoken(ctx) == ((Token) '['))
            neednum = 0;  // don't need a number on register name itself.
        pushback(ctx);
        ctx->tokenlen = tlen;
    } // if

    if (neednum)
    {
        uint32 ui32 = 0;
        if (!ui32fromtoken(ctx, &ui32))
            fail(ctx, "Invalid register index");
        regnum = (int) ui32;
    } // if

    // split up REG_TYPE_CONST
    if (regtype == REG_TYPE_CONST)
    {
        if (regnum < 2048)
        {
            regtype = REG_TYPE_CONST;
            regnum -= 0;
        } // if
        else if (regnum < 4096)
        {
            regtype = REG_TYPE_CONST2;
            regnum -= 2048;
        } // if
        else if (regnum < 6144)
        {
            regtype = REG_TYPE_CONST3;
            regnum -= 4096;
        } // if
        else if (regnum < 8192)
        {
            regtype = REG_TYPE_CONST4;
            regnum -= 6144;
        } // if
        else
        {
            fail(ctx, "Invalid const register index");
        } // else
    } // if

    *rtype = regtype;
    *rnum = regnum;

    return 1;
}